

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O0

void __thiscall Trick::print_trick(Trick *this)

{
  bool bVar1;
  ostream *poVar2;
  reference __t;
  __tuple_element_t<1UL,_tuple<int,_Card>_> *p_Var3;
  Card local_48 [4];
  __tuple_element_t<1UL,_tuple<int,_Card>_> local_28;
  Card card;
  __normal_iterator<std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
  local_18;
  iterator it;
  Trick *this_local;
  
  it._M_current = (tuple<int,_Card> *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Printing trick....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18._M_current =
       (tuple<int,_Card> *)
       std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::begin
                 (&this->m_trick_pile);
  while( true ) {
    card = (Card)std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>::end
                           (&this->m_trick_pile);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
                        *)&card);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
          ::operator*(&local_18);
    p_Var3 = std::get<1ul,int,Card>(__t);
    local_28 = *p_Var3;
    poVar2 = std::operator<<((ostream *)&std::cout,"Card is ");
    Card::Card2Str_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_Card>_*,_std::vector<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>_>
    ::operator++(&local_18);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"....");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Trick::print_trick()
{
    std::cout << "Printing trick...." << std::endl;
    for(std::vector<player_move>::iterator it = m_trick_pile.begin(); it != m_trick_pile.end(); ++it) {
        Card card = std::get<1>(*it);
        std::cout << "Card is " << card.Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}